

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmloutput.cpp
# Opt level: O2

QString * __thiscall
XmlOutput::doConversion(QString *__return_storage_ptr__,XmlOutput *this,QString *text)

{
  char16_t a;
  ConverstionType CVar1;
  char16_t *pcVar2;
  ulong uVar3;
  qsizetype qVar4;
  char *pcVar5;
  QChar QVar6;
  int i;
  ulong uVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = (text->d).size;
  if (uVar3 == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
    goto LAB_001e244f;
  }
  CVar1 = this->conversion;
  if (CVar1 == NoConversion) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&text->d);
      return __return_storage_ptr__;
    }
    goto LAB_001e244f;
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QVar6.ucs = (char16_t)__return_storage_ptr__;
  if (CVar1 == XMLConversion) {
    for (uVar7 = 0; uVar7 < uVar3; uVar7 = uVar7 + 1) {
      pcVar2 = (text->d).ptr;
      a = pcVar2[uVar7];
      if (a == L'>') {
        pcVar5 = "&gt;";
LAB_001e2322:
        QtPrivate::lengthHelperPointer<char>(pcVar5);
LAB_001e2333:
        QString::append((QLatin1String *)__return_storage_ptr__);
      }
      else {
        if (a == L'<') {
          QtPrivate::lengthHelperPointer<char>("&lt;");
          goto LAB_001e2333;
        }
        if (a == L'&') {
          if ((((uVar3 <= uVar7 + 7) || (pcVar2[uVar7 + 1] != L'#')) || (pcVar2[uVar7 + 2] != L'x'))
             || (pcVar2[uVar7 + 7] != L';')) {
            pcVar5 = "&amp;";
            goto LAB_001e2322;
          }
LAB_001e2349:
          QString::append(QVar6);
        }
        else {
          if (0x1f < (ushort)a) goto LAB_001e2349;
          QString::QString((QString *)&local_68,"&#x%1;");
          QString::arg<unsigned_short,_true>
                    ((QString *)&local_50,(QString *)&local_68,a,2,0x10,(QChar)0x30);
          QString::append((QString *)__return_storage_ptr__);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
        }
      }
      uVar3 = (text->d).size;
    }
  }
  else {
    QString::operator=(__return_storage_ptr__,(QString *)text);
  }
  if (this->conversion == EscapeConversion) {
    qVar4 = QtPrivate::lengthHelperPointer<char>("\\\"");
    QString::replace(QVar6,(QLatin1String *)0x22,(CaseSensitivity)qVar4);
    pcVar5 = "\\\'";
LAB_001e2411:
    qVar4 = QtPrivate::lengthHelperPointer<char>(pcVar5);
    QString::replace(QVar6,(QLatin1String *)0x27,(CaseSensitivity)qVar4);
  }
  else if (this->conversion == XMLConversion) {
    qVar4 = QtPrivate::lengthHelperPointer<char>("&quot;");
    QString::replace(QVar6,(QLatin1String *)0x22,(CaseSensitivity)qVar4);
    pcVar5 = "&apos;";
    goto LAB_001e2411;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_001e244f:
  __stack_chk_fail();
}

Assistant:

QString XmlOutput::doConversion(const QString &text)
{
    if (!text.size())
        return QString();
    else if (conversion == NoConversion)
        return text;

    QString output;
    if (conversion == XMLConversion) {

        // this is a way to escape characters that shouldn't be converted
        for (int i=0; i<text.size(); ++i) {
            const QChar c = text.at(i);
            if (c == QLatin1Char('&')) {
                if ( (i + 7) < text.size() &&
                    text.at(i + 1) == QLatin1Char('#') &&
                    text.at(i + 2) == QLatin1Char('x') &&
                    text.at(i + 7) == QLatin1Char(';') ) {
                    output += text.at(i);
                } else {
                    output += QLatin1String("&amp;");
                }
            } else if (c == QLatin1Char('<')) {
                output += QLatin1String("&lt;");
            } else if (c == QLatin1Char('>')) {
                output += QLatin1String("&gt;");
            } else {
                if (c.unicode() < 0x20) {
                    output += QString("&#x%1;").arg(ushort{c.unicode()}, 2, 16, QLatin1Char('0'));
                } else {
                    output += c;
                }
            }
        }
    } else {
        output = text;
    }

    if (conversion == XMLConversion) {
        output.replace('\"', QLatin1String("&quot;"));
        output.replace('\'', QLatin1String("&apos;"));
    } else if (conversion == EscapeConversion) {
        output.replace('\"', QLatin1String("\\\""));
        output.replace('\'', QLatin1String("\\\'"));
    }
    return output;
}